

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O2

void __thiscall sznet::net::SelectPoller::updateChannel(SelectPoller *this,Channel *channel)

{
  ChannelMap *this_00;
  _Rb_tree_header *p_Var1;
  pointer pEVar2;
  self *psVar3;
  LogStream *this_01;
  iterator iVar4;
  mapped_type *ppCVar5;
  long lVar6;
  SourceFile file;
  Logger local_1008;
  undefined1 local_38 [12];
  
  Poller::assertInLoopThread(&this->super_Poller);
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_38,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_38._0_8_;
    file.m_size = local_38._8_4_;
    Logger::Logger(&local_1008,file,0x70,TRACE,"updateChannel");
    psVar3 = LogStream::operator<<(&local_1008.m_impl.m_stream,"fd = ");
    this_01 = LogStream::operator<<(psVar3,channel->m_fd);
    psVar3 = LogStream::operator<<(this_01," events = ");
    LogStream::operator<<(psVar3,channel->m_events);
    Logger::~Logger(&local_1008);
  }
  this_00 = &(this->super_Poller).m_channels;
  p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
  if (channel->m_index < 0) {
    local_1008.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = channel->m_fd;
    iVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::find(&this_00->_M_t,(key_type_conflict *)&local_1008);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      __assert_fail("m_channels.find(channel->fd()) == m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x74,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    local_1008.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = channel->m_fd;
    local_1008.m_impl.m_time.m_microSecondsSinceEpoch._4_4_ = channel->m_events;
    std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
    push_back(&this->m_pollfds,(value_type *)&local_1008);
    channel->m_index =
         (int)((ulong)((long)(this->m_pollfds).
                             super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_pollfds).
                            super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    ppCVar5 = std::
              map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::operator[](this_00,(key_type_conflict *)&local_1008);
    *ppCVar5 = channel;
  }
  else {
    local_1008.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = channel->m_fd;
    iVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::find(&this_00->_M_t,(key_type_conflict *)&local_1008);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x81,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    local_1008.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = channel->m_fd;
    ppCVar5 = std::
              map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::operator[](this_00,(key_type_conflict *)&local_1008);
    if (*ppCVar5 != channel) {
      __assert_fail("m_channels[channel->fd()] == channel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x82,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    lVar6 = (long)channel->m_index;
    if ((lVar6 < 0) ||
       (pEVar2 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->m_pollfds).
                           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) >> 3) <=
       channel->m_index)) {
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x84,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    if (pEVar2[lVar6].fd != channel->m_fd) {
      __assert_fail("event.fd == channel->fd()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x86,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    pEVar2[lVar6].ev = channel->m_events;
  }
  return;
}

Assistant:

void SelectPoller::updateChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd() << " events = " << channel->events();
	// add
	if (channel->index() < 0)
	{
		assert(m_channels.find(channel->fd()) == m_channels.end());
		Channel::Event_t event;
		event.fd = channel->fd();
		event.ev = channel->events();
		m_pollfds.push_back(event);
		int idx = static_cast<int>(m_pollfds.size()) - 1;
		channel->set_index(idx);
		m_channels[event.fd] = channel;
	}
	// mod
	else
	{
		// channel事件有能为kNoneEvent
		assert(m_channels.find(channel->fd()) != m_channels.end());
		assert(m_channels[channel->fd()] == channel);
		int idx = channel->index();
		assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
		Channel::Event_t& event = m_pollfds[idx];
		assert(event.fd == channel->fd());
		event.ev = channel->events();
	}
}